

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O1

bool sptk::GaussianMixtureModeling::CalculateLogProbability
               (int num_order,int num_mixture,bool is_diagonal,bool check_size,
               vector<double,_std::allocator<double>_> *input_vector,
               vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *mean_vectors,
               vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
               *covariance_matrices,
               vector<double,_std::allocator<double>_> *components_of_log_probability,
               double *log_probability,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *this_00;
  double dVar1;
  pointer pdVar2;
  bool bVar3;
  double *pdVar4;
  ulong uVar5;
  size_type __new_size;
  pointer pdVar6;
  uint length;
  ulong uVar8;
  int m;
  uint column;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  vector<double,_std::allocator<double>_> diag;
  SymmetricMatrix tmp;
  vector<double,_std::allocator<double>_> local_98;
  ulong local_80;
  ulong local_78;
  undefined1 local_70 [16];
  uint local_60;
  ulong uVar7;
  
  if (-1 < num_mixture) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    length = num_order + 1;
    uVar7 = (ulong)length;
    __new_size = (size_type)(int)length;
    if ((long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      return false;
    }
    if ((!check_size) ||
       (bVar3 = anon_unknown.dwarf_23245::CheckGmm
                          (num_mixture,length,weights,mean_vectors,covariance_matrices), bVar3)) {
      uVar5 = (ulong)(uint)num_mixture;
      if ((components_of_log_probability != (vector<double,_std::allocator<double>_> *)0x0) &&
         ((long)(components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>)
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>)
                ._M_impl.super__Vector_impl_data._M_start >> 3 != uVar5)) {
        std::vector<double,_std::allocator<double>_>::resize(components_of_log_probability,uVar5);
      }
      if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
      }
      this = &buffer->gconsts_;
      if ((long)(buffer->gconsts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->gconsts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != uVar5) {
        std::vector<double,_std::allocator<double>_>::resize(this,uVar5);
      }
      this_00 = &buffer->precisions_;
      if ((long)(buffer->precisions_).
                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->precisions_).
                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>.
                _M_impl.super__Vector_impl_data._M_start >> 6 != uVar5) {
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::resize
                  (this_00,uVar5);
      }
      if (buffer->precomputed_ == false) {
        if (num_mixture != 0) {
          dVar11 = (double)(int)length * 1.8378770664093453;
          uVar5 = 1;
          if (1 < num_mixture) {
            uVar5 = (ulong)(uint)num_mixture;
          }
          uVar8 = 0;
          do {
            if (is_diagonal) {
              if (num_order < 0) {
                dVar12 = 0.0;
              }
              else {
                column = 0;
                dVar12 = 0.0;
                do {
                  local_70._8_8_ =
                       (covariance_matrices->
                       super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar8;
                  local_70._0_8_ = &PTR__Row_0011fac0;
                  local_60 = column;
                  pdVar4 = SymmetricMatrix::Row::operator[]((Row *)local_70,column);
                  dVar13 = log(*pdVar4);
                  dVar12 = dVar12 + dVar13;
                  column = column + 1;
                } while (length != column);
              }
              dVar12 = dVar12 + dVar11;
            }
            else {
              SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_70,0);
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (double *)0x0;
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (double *)0x0;
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar3 = SymmetricMatrix::CholeskyDecomposition
                                ((covariance_matrices->
                                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar8,
                                 (SymmetricMatrix *)local_70,&local_98);
              pdVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              dVar12 = dVar11;
              if (bVar3) {
                dVar12 = 0.0;
                pdVar6 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  do {
                    dVar13 = log(*pdVar6);
                    dVar12 = dVar12 + dVar13;
                    pdVar6 = pdVar6 + 1;
                  } while (pdVar6 != pdVar2);
                  dVar12 = dVar12 + 0.0;
                }
                dVar12 = dVar12 + dVar11;
              }
              if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (double *)0x0) {
                operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
              }
              SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_70);
              if (!bVar3) {
                return false;
              }
            }
            (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar8] = dVar12;
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar5);
        }
        if (num_mixture != 0 && !is_diagonal) {
          uVar5 = 1;
          if (1 < num_mixture) {
            uVar5 = (ulong)(uint)num_mixture;
          }
          lVar10 = 0;
          do {
            bVar3 = SymmetricMatrix::Invert
                              ((SymmetricMatrix *)
                               ((long)&((covariance_matrices->
                                        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                       _vptr_SymmetricMatrix + lVar10),
                               (SymmetricMatrix *)
                               ((long)&((this_00->
                                        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                       _vptr_SymmetricMatrix + lVar10));
            if (!bVar3) {
              return false;
            }
            lVar10 = lVar10 + 0x40;
          } while (uVar5 * 0x40 != lVar10);
        }
        buffer->precomputed_ = true;
      }
      if (num_mixture == 0) {
        dVar11 = -10000000000.0;
      }
      else {
        pdVar2 = (input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_80 = 1;
        if (1 < num_mixture) {
          local_80 = (ulong)(uint)num_mixture;
        }
        dVar11 = -10000000000.0;
        uVar5 = 0;
        do {
          dVar12 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5];
          lVar10 = *(long *)&(mean_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar5].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          local_78 = uVar5;
          if (is_diagonal) {
            if (-1 < num_order) {
              uVar8 = 0;
              do {
                dVar13 = pdVar2[uVar8] - *(double *)(lVar10 + uVar8 * 8);
                local_70._8_8_ =
                     (covariance_matrices->
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar5;
                local_70._0_8_ = &PTR__Row_0011fac0;
                local_60 = (uint)uVar8;
                pdVar4 = SymmetricMatrix::Row::operator[]((Row *)local_70,local_60);
                dVar12 = dVar12 + (dVar13 * dVar13) / *pdVar4;
                uVar8 = uVar8 + 1;
              } while (uVar7 != uVar8);
            }
          }
          else {
            pdVar6 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (-1 < num_order) {
              uVar8 = 0;
              do {
                pdVar6[uVar8] = pdVar2[uVar8] - *(double *)(lVar10 + uVar8 * 8);
                uVar8 = uVar8 + 1;
              } while (uVar7 != uVar8);
            }
            if (-1 < num_order) {
              uVar8 = 0;
              do {
                dVar13 = 0.0;
                uVar9 = 0;
                do {
                  dVar1 = pdVar6[uVar9];
                  local_70._8_8_ =
                       (this_00->
                       super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar5;
                  local_70._0_8_ = &PTR__Row_0011fac0;
                  local_60 = (uint)uVar8;
                  pdVar4 = SymmetricMatrix::Row::operator[]((Row *)local_70,(int)uVar9);
                  dVar13 = dVar13 + dVar1 * *pdVar4;
                  uVar9 = uVar9 + 1;
                } while (uVar7 != uVar9);
                dVar12 = dVar12 + dVar13 * pdVar6[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar7);
            }
          }
          uVar5 = local_78;
          dVar13 = log((weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[local_78]);
          dVar13 = dVar12 * -0.5 + dVar13;
          if (components_of_log_probability != (vector<double,_std::allocator<double>_> *)0x0) {
            (components_of_log_probability->super__Vector_base<double,_std::allocator<double>_>).
            _M_impl.super__Vector_impl_data._M_start[uVar5] = dVar13;
          }
          dVar11 = AddInLogSpace(dVar11,dVar13);
          uVar5 = uVar5 + 1;
        } while (uVar5 != local_80);
      }
      if (log_probability != (double *)0x0) {
        *log_probability = dVar11;
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool GaussianMixtureModeling::CalculateLogProbability(
    int num_order, int num_mixture, bool is_diagonal, bool check_size,
    const std::vector<double>& input_vector, const std::vector<double>& weights,
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    std::vector<double>* components_of_log_probability, double* log_probability,
    GaussianMixtureModeling::Buffer* buffer) {
  // Check inputs.
  const int length(num_order + 1);
  if (num_mixture < 0 ||
      input_vector.size() != static_cast<std::size_t>(length) ||
      NULL == buffer) {
    return false;
  }

  // Check size of GMM.
  if (check_size && !CheckGmm(num_mixture, length, weights, mean_vectors,
                              covariance_matrices)) {
    return false;
  }

  // Prepare memories.
  if (components_of_log_probability &&
      components_of_log_probability->size() !=
          static_cast<std::size_t>(num_mixture)) {
    components_of_log_probability->resize(num_mixture);
  }
  if (buffer->d_.size() != static_cast<std::size_t>(length)) {
    buffer->d_.resize(length);
  }
  if (buffer->gconsts_.size() != static_cast<std::size_t>(num_mixture)) {
    buffer->gconsts_.resize(num_mixture);
  }
  if (buffer->precisions_.size() != static_cast<std::size_t>(num_mixture)) {
    buffer->precisions_.resize(num_mixture);
  }

  if (!buffer->precomputed_) {
    // Precompute constant of log likelihood without multiplying -0.5.
    for (int k(0); k < num_mixture; ++k) {
      double gconst(length * std::log(sptk::kTwoPi));
      double log_determinant(0.0);
      if (is_diagonal) {
        for (int l(0); l <= num_order; ++l) {
          log_determinant += std::log(covariance_matrices[k][l][l]);
        }
        gconst += log_determinant;
      } else {
        SymmetricMatrix tmp;
        std::vector<double> diag;
        if (!covariance_matrices[k].CholeskyDecomposition(&tmp, &diag)) {
          return false;
        }
        log_determinant += std::accumulate(
            diag.begin(), diag.end(), 0.0,
            [](double acc, double x) { return acc + std::log(x); });
        gconst += log_determinant;
      }
      buffer->gconsts_[k] = gconst;
    }

    // Precompute inverse of covariance matrix.
    if (!is_diagonal) {
      for (int k(0); k < num_mixture; ++k) {
        if (!covariance_matrices[k].Invert(&(buffer->precisions_[k]))) {
          return false;
        }
      }
    }

    buffer->precomputed_ = true;
  }

  const double* x(&(input_vector[0]));
  double total(sptk::kLogZero);

  // Compute log probability of data.
  for (int k(0); k < num_mixture; ++k) {
    double sum(buffer->gconsts_[k]);
    const double* mu(&(mean_vectors[k][0]));
    if (is_diagonal) {
      for (int l(0); l <= num_order; ++l) {
        const double diff(x[l] - mu[l]);
        sum += diff * diff / covariance_matrices[k][l][l];
      }
    } else {
      double* d(&(buffer->d_[0]));
      for (int l(0); l <= num_order; ++l) {
        d[l] = x[l] - mu[l];
      }
      for (int l(0); l <= num_order; ++l) {
        double tmp(0.0);
        for (int m(0); m <= num_order; ++m) {
          tmp += d[m] * buffer->precisions_[k][l][m];
        }
        sum += tmp * d[l];
      }
    }

    const double p(std::log(weights[k]) - 0.5 * sum);
    if (components_of_log_probability) {
      (*components_of_log_probability)[k] = p;
    }
    total = AddInLogSpace(total, p);
  }

  if (log_probability) {
    *log_probability = total;
  }

  return true;
}